

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

void __thiscall
lzham::lzcompressor::parse_job_callback(lzcompressor *this,uint64 data,void *pData_ptr)

{
  atomic32_t aVar1;
  long releaseCount;
  uint in_ESI;
  long in_RDI;
  parse_thread_state *parse_state;
  scoped_perf_section parse_job_timer;
  uint parse_job_index;
  parse_thread_state *in_stack_00000d40;
  lzcompressor *in_stack_00000d48;
  parse_thread_state *in_stack_00000ec0;
  lzcompressor *in_stack_00000ec8;
  undefined4 in_stack_ffffffffffffffe0;
  
  scoped_perf_section::scoped_perf_section
            ((scoped_perf_section *)&stack0xffffffffffffffe3,cVarArgs,"parse_job_callback %u",
             (ulong)in_ESI);
  releaseCount = in_RDI + 0xcbb8 + (ulong)in_ESI * 0xb2b00;
  if (((*(uint *)(in_RDI + 0x17b0) & 2) == 0) || (*(int *)(in_RDI + 0x179c) != 4)) {
    optimal_parse(in_stack_00000d48,in_stack_00000d40);
  }
  else {
    extreme_parse(in_stack_00000ec8,in_stack_00000ec0);
  }
  aVar1 = atomic_decrement32((atomic32_t *)(in_RDI + 0x5a23b8));
  if (aVar1 == 0) {
    semaphore::release((semaphore *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),releaseCount);
  }
  return;
}

Assistant:

void lzcompressor::parse_job_callback(uint64 data, void* pData_ptr)
   {
      const uint parse_job_index = (uint)data;
      scoped_perf_section parse_job_timer(cVarArgs, "parse_job_callback %u", parse_job_index);

      (void)pData_ptr;

      parse_thread_state &parse_state = m_parse_thread_state[parse_job_index];

#if 0
      if (m_params.m_compression_level == cCompressionLevelFastest)
         greedy_parse(parse_state);
      else
#endif
      if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_EXTREME_PARSING) && (m_params.m_compression_level == cCompressionLevelUber))
         extreme_parse(parse_state);
      else
         optimal_parse(parse_state);

      LZHAM_MEMORY_EXPORT_BARRIER

      if (atomic_decrement32(&m_parse_jobs_remaining) == 0)
      {
         m_parse_jobs_complete.release();
      }
   }